

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddAddApply.c
# Opt level: O0

DdNode * Cudd_addTimes(DdManager *dd,DdNode **f,DdNode **g)

{
  DdManager *pDVar1;
  DdManager *pDVar2;
  double value;
  DdNode *G;
  DdNode *F;
  DdNode *res;
  DdNode **g_local;
  DdNode **f_local;
  DdManager *dd_local;
  
  pDVar1 = (DdManager *)*f;
  pDVar2 = (DdManager *)*g;
  if ((pDVar1 == (DdManager *)dd->zero) || (pDVar2 == (DdManager *)dd->zero)) {
    dd_local = (DdManager *)dd->zero;
  }
  else {
    dd_local = pDVar2;
    if ((pDVar1 != (DdManager *)dd->one) && (dd_local = pDVar1, pDVar2 != (DdManager *)dd->one)) {
      if (((pDVar1->sentinel).index == 0x7fffffff) && ((pDVar2->sentinel).index == 0x7fffffff)) {
        dd_local = (DdManager *)
                   cuddUniqueConst(dd,(pDVar1->sentinel).type.value * (pDVar2->sentinel).type.value)
        ;
      }
      else {
        if (pDVar2 < pDVar1) {
          *f = (DdNode *)pDVar2;
          *g = (DdNode *)pDVar1;
        }
        dd_local = (DdManager *)0x0;
      }
    }
  }
  return &dd_local->sentinel;
}

Assistant:

DdNode *
Cudd_addTimes(
  DdManager * dd,
  DdNode ** f,
  DdNode ** g)
{
    DdNode *res;
    DdNode *F, *G;
    CUDD_VALUE_TYPE value;

    F = *f; G = *g;
    if (F == DD_ZERO(dd) || G == DD_ZERO(dd)) return(DD_ZERO(dd));
    if (F == DD_ONE(dd)) return(G);
    if (G == DD_ONE(dd)) return(F);
    if (cuddIsConstant(F) && cuddIsConstant(G)) {
        value = cuddV(F)*cuddV(G);
        res = cuddUniqueConst(dd,value);
        return(res);
    }
    if (F > G) { /* swap f and g */
        *f = G;
        *g = F;
    }
    return(NULL);

}